

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.h
# Opt level: O0

bool google::protobuf::compiler::csharp::IsWrapperType(FieldDescriptor *descriptor)

{
  Type TVar1;
  Descriptor *this;
  FileDescriptor *this_00;
  string *__lhs;
  bool local_11;
  FieldDescriptor *descriptor_local;
  
  TVar1 = FieldDescriptor::type(descriptor);
  local_11 = false;
  if (TVar1 == TYPE_MESSAGE) {
    this = FieldDescriptor::message_type(descriptor);
    this_00 = Descriptor::file(this);
    __lhs = FileDescriptor::name_abi_cxx11_(this_00);
    local_11 = std::operator==(__lhs,"google/protobuf/wrappers.proto");
  }
  return local_11;
}

Assistant:

inline bool IsWrapperType(const FieldDescriptor* descriptor) {
  return descriptor->type() == FieldDescriptor::TYPE_MESSAGE &&
      descriptor->message_type()->file()->name() == "google/protobuf/wrappers.proto";
}